

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteStates.cpp
# Opt level: O1

string * __thiscall
MADPComponentDiscreteStates::SoftPrintStates_abi_cxx11_
          (string *__return_storage_ptr__,MADPComponentDiscreteStates *this)

{
  pointer pSVar1;
  char cVar2;
  pointer pSVar3;
  stringstream ss;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  pSVar3 = (this->_m_stateVec).super__Vector_base<StateDiscrete,_std::allocator<StateDiscrete>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (this->_m_stateVec).super__Vector_base<StateDiscrete,_std::allocator<StateDiscrete>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pSVar3 != pSVar1) {
    do {
      (*(pSVar3->super_State).super_NamedDescribedEntity._vptr_NamedDescribedEntity[2])
                (&local_1d8,pSVar3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(char *)local_1d8,local_1d0);
      if (local_1d8 != local_1c8) {
        operator_delete(local_1d8,local_1c8[0] + 1);
      }
      cVar2 = (char)(ostream *)local_1a8;
      std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      pSVar3 = pSVar3 + 1;
    } while (pSVar3 != pSVar1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

string MADPComponentDiscreteStates::SoftPrintStates() const
{    
    stringstream ss;
    vector<StateDiscrete>::const_iterator it = _m_stateVec.begin();
    vector<StateDiscrete>::const_iterator last = _m_stateVec.end();
    while(it!=last)
    {
        ss << (*it).SoftPrint();
        ss << endl;
        it++;
    }
    return(ss.str());
}